

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# security_materials.cpp
# Opt level: O1

Error * ot::commissioner::security_material::GetDomainSM
                  (Error *__return_storage_ptr__,string *aDid,SecurityMaterials *aSM)

{
  ErrorCode EVar1;
  undefined4 uVar2;
  undefined1 auVar3 [8];
  _Alloc_hider _Var4;
  Error *pEVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  long lVar9;
  pointer __rhs;
  bool bVar10;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>
  __l;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  Error tokenError;
  string path;
  string out;
  writer write_1;
  string domPath;
  ByteArray bytes;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
  smElements;
  writer write;
  undefined1 local_228 [8];
  _Alloc_hider _Stack_220;
  undefined1 local_218 [24];
  parse_func local_200 [2] [1];
  undefined1 local_1f0 [16];
  ByteArray *local_1e0;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  ByteArray *local_1b8;
  Error *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  Error local_188;
  string *local_158;
  writer local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  ByteArray local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  SecurityMaterials *local_100;
  pointer local_f8;
  string local_f0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
  local_d0;
  string local_b8;
  string local_98;
  string local_78 [2];
  
  __return_storage_ptr__->mCode = kNone;
  local_158 = (string *)&__return_storage_ptr__->mMessage;
  local_108 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_108;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  local_148._M_string_length = 0;
  local_148.field_2._M_local_buf[0] = '\0';
  local_228 = (undefined1  [8])local_218;
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"cert.pem","");
  local_218._16_8_ = &aSM->mCertificate;
  local_200[0][0] = (parse_func)local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"priv.pem","");
  local_1e0 = &aSM->mPrivateKey;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"ca.pem","");
  local_1b8 = &aSM->mTrustAnchor;
  __l._M_len = 3;
  __l._M_array = (iterator)local_228;
  local_100 = aSM;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
  ::vector(&local_d0,__l,(allocator_type *)&local_188);
  lVar9 = 0;
  do {
    if (local_1c8 + lVar9 != *(undefined1 **)((long)local_1d8 + lVar9)) {
      operator_delete(*(undefined1 **)((long)local_1d8 + lVar9));
    }
    lVar9 = lVar9 + -0x28;
  } while (lVar9 != -0x78);
  local_228 = (undefined1  [8])local_218;
  std::__cxx11::string::_M_construct<char*>((string *)local_228,smRoot,DAT_003ae080 + smRoot);
  _Var4._M_p = _Stack_220._M_p;
  if (local_228 != (undefined1  [8])local_218) {
    operator_delete((void *)local_228);
  }
  if (_Var4._M_p != (pointer)0x0) {
    local_228 = (undefined1  [8])local_218;
    std::__cxx11::string::_M_construct<char*>((string *)local_228,smRoot,DAT_003ae080 + smRoot);
    pcVar7 = (char *)std::__cxx11::string::append(local_228);
    pcVar7 = (char *)std::__cxx11::string::_M_append(pcVar7,(ulong)(aDid->_M_dataplus)._M_p);
    std::__cxx11::string::append(pcVar7);
    std::__cxx11::string::_M_assign((string *)&local_148);
    if (local_228 != (undefined1  [8])local_218) {
      operator_delete((void *)local_228);
    }
    local_78[0]._M_dataplus._M_p = (pointer)&local_78[0].field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,local_148._M_dataplus._M_p,
               local_148._M_dataplus._M_p + local_148._M_string_length);
    PathExists((Error *)local_228,local_78);
    pEVar5 = local_1b0;
    local_1b0->mCode = local_228._0_4_;
    std::__cxx11::string::operator=(local_158,(string *)&_Stack_220);
    EVar1 = pEVar5->mCode;
    if (_Stack_220._M_p != local_218 + 8) {
      operator_delete(_Stack_220._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78[0]._M_dataplus._M_p != &local_78[0].field_2) {
      operator_delete(local_78[0]._M_dataplus._M_p);
    }
    if (EVar1 == kNone) {
      local_f8 = local_d0.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (local_d0.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_d0.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __rhs = local_d0.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::operator+(&local_1a8,&local_148,&__rhs->first);
          local_228 = (undefined1  [8])((ulong)local_228 & 0xffffffff00000000);
          _Stack_220._M_p = local_218 + 8;
          local_218._0_8_ = 0;
          local_218._8_8_ = local_218._8_8_ & 0xffffffffffffff00;
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,local_1a8._M_dataplus._M_p,
                     local_1a8._M_string_length + local_1a8._M_dataplus._M_p);
          PathExists(&local_188,&local_f0);
          uVar2 = local_228._0_4_;
          EVar1 = local_188.mCode;
          if (local_188.mMessage._M_dataplus._M_p != (pointer)((long)&local_188 + 0x18U)) {
            operator_delete(local_188.mMessage._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          if (_Stack_220._M_p != local_218 + 8) {
            operator_delete(_Stack_220._M_p);
          }
          if (uVar2 == EVar1) {
            local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ReadPemFile((Error *)local_228,&local_128,&local_1a8);
            local_1b0->mCode = local_228._0_4_;
            std::__cxx11::string::operator=(local_158,(string *)&_Stack_220);
            if (_Stack_220._M_p != local_218 + 8) {
              operator_delete(_Stack_220._M_p);
            }
            auVar3 = local_228;
            local_228 = (undefined1  [8])((ulong)local_228 & 0xffffffff00000000);
            _Stack_220._M_p = local_218 + 8;
            local_218._0_8_ = 0;
            local_218._8_8_ = local_218._8_8_ & 0xffffffffffffff00;
            if (local_1b0->mCode == kNone) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                        (__rhs->second,&local_128);
            }
            else {
              if (gVerbose == '\x01') {
                local_228._4_4_ = auVar3._4_4_;
                local_228._0_4_ = 0xd;
                pcVar7 = "Failed to read security data from file {}";
                _Stack_220._M_p = "Failed to read security data from file {}";
                local_218._0_8_ = 0x29;
                local_218._8_8_ = 0x100000000;
                local_200[0][0] =
                     ::fmt::v10::detail::
                     parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                ;
                local_218._16_8_ = (ByteArray *)local_228;
                local_b8._M_dataplus._M_p = local_228;
                do {
                  if (pcVar7 == "") break;
                  pcVar8 = pcVar7;
                  if (*pcVar7 == '{') {
LAB_0028f7cc:
                    ::fmt::v10::detail::
                    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::writer::operator()((writer *)&local_b8,pcVar7,pcVar8);
                    pcVar7 = ::fmt::v10::detail::
                             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                       (pcVar8,"",
                                        (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)local_228);
                    bVar10 = true;
                  }
                  else {
                    pcVar8 = pcVar7 + 1;
                    bVar10 = pcVar8 != "";
                    if (bVar10) {
                      if (*pcVar8 != '{') {
                        pcVar6 = pcVar7 + 2;
                        do {
                          pcVar8 = pcVar6;
                          bVar10 = pcVar8 != "";
                          if (pcVar8 == "") goto LAB_0028f7c8;
                          pcVar6 = pcVar8 + 1;
                        } while (*pcVar8 != '{');
                      }
                      bVar10 = true;
                    }
LAB_0028f7c8:
                    if (bVar10) goto LAB_0028f7cc;
                    ::fmt::v10::detail::
                    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::writer::operator()((writer *)&local_b8,pcVar7,"");
                    bVar10 = false;
                  }
                } while (bVar10);
                local_228 = (undefined1  [8])local_1a8._M_dataplus._M_p;
                _Stack_220._M_p = (pointer)local_1a8._M_string_length;
                fmt.size_ = 0xd;
                fmt.data_ = (char *)0x29;
                args.field_1.args_ = in_R9.args_;
                args.desc_ = (unsigned_long_long)local_228;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)&local_188,(v10 *)"Failed to read security data from file {}",
                           fmt,args);
                Console::Write((string *)&local_188,kRed);
              }
              else {
                local_188._0_8_ = (long)&local_188 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_188,"security-materials","");
                local_228._0_4_ = 0xd;
                pcVar7 = "Failed to read security data from file {}";
                _Stack_220._M_p = "Failed to read security data from file {}";
                local_218._0_8_ = 0x29;
                local_218._8_8_ = 0x100000000;
                local_200[0][0] =
                     ::fmt::v10::detail::
                     parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                ;
                local_218._16_8_ = (ByteArray *)local_228;
                local_150.handler_ =
                     (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_228;
                do {
                  if (pcVar7 == "") break;
                  pcVar8 = pcVar7;
                  if (*pcVar7 == '{') {
LAB_0028f903:
                    ::fmt::v10::detail::
                    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::writer::operator()(&local_150,pcVar7,pcVar8);
                    pcVar7 = ::fmt::v10::detail::
                             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                       (pcVar8,"",
                                        (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)local_228);
                    bVar10 = true;
                  }
                  else {
                    pcVar8 = pcVar7 + 1;
                    bVar10 = pcVar8 != "";
                    if (bVar10) {
                      if (*pcVar8 != '{') {
                        pcVar6 = pcVar7 + 2;
                        do {
                          pcVar8 = pcVar6;
                          bVar10 = pcVar8 != "";
                          if (pcVar8 == "") goto LAB_0028f8ff;
                          pcVar6 = pcVar8 + 1;
                        } while (*pcVar8 != '{');
                      }
                      bVar10 = true;
                    }
LAB_0028f8ff:
                    if (bVar10) goto LAB_0028f903;
                    ::fmt::v10::detail::
                    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::writer::operator()(&local_150,pcVar7,"");
                    bVar10 = false;
                  }
                } while (bVar10);
                local_228 = (undefined1  [8])local_1a8._M_dataplus._M_p;
                _Stack_220._M_p = (pointer)local_1a8._M_string_length;
                fmt_00.size_ = 0xd;
                fmt_00.data_ = (char *)0x29;
                args_00.field_1.args_ = in_R9.args_;
                args_00.desc_ = (unsigned_long_long)local_228;
                ::fmt::v10::vformat_abi_cxx11_
                          (&local_b8,(v10 *)"Failed to read security data from file {}",fmt_00,
                           args_00);
                Log(kError,(string *)&local_188,&local_b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                  operator_delete(local_b8._M_dataplus._M_p);
                }
              }
              if ((pointer)local_188._0_8_ != (pointer)((long)&local_188 + 0x10U)) {
                operator_delete((void *)local_188._0_8_);
              }
            }
            if (local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_128.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p);
          }
          __rhs = __rhs + 1;
        } while (__rhs != local_f8);
      }
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a8,local_148._M_dataplus._M_p,
                 local_148._M_dataplus._M_p + local_148._M_string_length);
      std::__cxx11::string::append((char *)&local_1a8);
      local_228 = (undefined1  [8])((ulong)local_228 & 0xffffffff00000000);
      _Stack_220._M_p = local_218 + 8;
      local_218._0_8_ = 0;
      local_218._8_8_ = local_218._8_8_ & 0xffffffffffffff00;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,local_1a8._M_dataplus._M_p,
                 local_1a8._M_string_length + local_1a8._M_dataplus._M_p);
      PathExists(&local_188,&local_98);
      uVar2 = local_228._0_4_;
      EVar1 = local_188.mCode;
      if (local_188.mMessage._M_dataplus._M_p != (pointer)((long)&local_188 + 0x18U)) {
        operator_delete(local_188.mMessage._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if (_Stack_220._M_p != local_218 + 8) {
        operator_delete(_Stack_220._M_p);
      }
      if (uVar2 == EVar1) {
        local_188._0_8_ = (pointer)0x0;
        local_188.mMessage._M_dataplus._M_p = (pointer)0x0;
        local_188.mMessage._M_string_length = 0;
        ReadHexStringFile((Error *)local_228,(ByteArray *)&local_188,&local_1a8);
        if (local_228._0_4_ == none_type) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (&local_100->mCommissionerToken,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188);
        }
        if (_Stack_220._M_p != local_218 + 8) {
          operator_delete(_Stack_220._M_p);
        }
        if ((pointer)local_188._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_188._0_8_);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
    }
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
  ::~vector(&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  return local_1b0;
}

Assistant:

Error GetDomainSM(const std::string &aDid, SecurityMaterials &aSM)
{
    Error               error;
    std::string         domPath;
    std::vector<SMPair> smElements{
        {"cert.pem", &aSM.mCertificate}, {"priv.pem", &aSM.mPrivateKey}, {"ca.pem", &aSM.mTrustAnchor}};

    // If SM root is unset, do nothing
    VerifyOrExit(!smRoot.Get().empty());

    domPath = smRoot.Get().append("dom/").append(aDid).append("/");
    SuccessOrExit(error = PathExists(domPath));
    for (const auto &element : smElements)
    {
        std::string path = domPath + element.first;
        if (ERROR_NONE != PathExists(path))
        {
            continue;
        }
        ByteArray bytes;
        error = ReadPemFile(bytes, path);
        if (error != ERROR_NONE)
        {
            if (gVerbose)
            {
                std::string out = fmt::format(FMT_STRING(SM_ERROR_MESSAGE_PEM_READ_FAILED), path);
                Console::Write(out, Console::Color::kRed);
            }
            else
            {
                LOG_ERROR(LOG_REGION_SECURITY_MATERIALS, SM_ERROR_MESSAGE_PEM_READ_FAILED, path);
            }
        }
        else
        {
            *element.second = bytes;
        }
    }

    do
    {
        std::string path = domPath + "tok.cbor";
        if (ERROR_NONE != PathExists(path))
        {
            break;
        }
        ByteArray bytes;
        Error     tokenError = ReadHexStringFile(bytes, path);
        if (ERROR_NONE == tokenError)
        {
            aSM.mCommissionerToken = bytes;
        }
    } while (false);
exit:
    return error;
}